

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::does_dir_exist(char *pDir)

{
  int iVar1;
  char *in_RDI;
  int result;
  stat stat_buf;
  stat local_a0;
  bool local_1;
  
  iVar1 = stat(in_RDI,&local_a0);
  if (iVar1 == 0) {
    if (((local_a0.st_mode & 0xf000) == 0x4000) || ((local_a0.st_mode & 0xf000) == 0xa000)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool file_utils::does_dir_exist(const char* pDir) {
  struct stat stat_buf;
  int result = stat(pDir, &stat_buf);
  if (result)
    return false;
  if (S_ISDIR(stat_buf.st_mode) || S_ISLNK(stat_buf.st_mode))
    return true;
  return false;
}